

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void __thiscall QUndoStack::endMacro(QUndoStack *this)

{
  long lVar1;
  bool bVar2;
  QUndoStackPrivate *function;
  QList<QUndoCommand_*> *in_RDI;
  long in_FS_OFFSET;
  QUndoStackPrivate *d;
  char *in_stack_ffffffffffffffd8;
  QMessageLogger *in_stack_ffffffffffffffe0;
  QUndoStackPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  function = d_func((QUndoStack *)0xa84065);
  bVar2 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa84079);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),
               (char *)function);
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,"QUndoStack::endMacro(): no matching beginMacro()");
  }
  else {
    QList<QUndoCommand_*>::removeLast(in_RDI);
    bVar2 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa840cb);
    if (bVar2) {
      QUndoStackPrivate::checkUndoLimit(in_stack_ffffffffffffffe8);
      QUndoStackPrivate::setIndex((QUndoStackPrivate *)this,d._4_4_,d._3_1_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoStack::endMacro()
{
    Q_D(QUndoStack);
    if (Q_UNLIKELY(d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::endMacro(): no matching beginMacro()");
        return;
    }

    d->macro_stack.removeLast();

    if (d->macro_stack.isEmpty()) {
        d->checkUndoLimit();
        d->setIndex(d->index + 1, false);
    }
}